

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-decomposition.cpp
# Opt level: O2

int main(int param_1,char **param_2)

{
  BoolVector wrap_00;
  CoordinateVector ghosts_00;
  DivisionsVector divs;
  ostream *poVar1;
  int rank;
  CoordinateVector ghosts;
  pointer piStack_1c0;
  undefined4 uVar2;
  undefined4 uVar3;
  undefined8 uVar4;
  code *pcVar5;
  BoolVector share_face;
  BoolVector wrap;
  _Vector_base<int,_std::allocator<int>_> local_148;
  ContiguousAssigner assigner;
  _Bvector_base<std::allocator<bool>_> local_118;
  _Vector_base<int,_std::allocator<int>_> local_f0;
  _Bvector_base<std::allocator<bool>_> local_d8;
  Bounds domain;
  
  assigner.super_StaticAssigner.super_Assigner.size_ = 8;
  assigner.super_StaticAssigner.super_Assigner.nblocks_ = 0x20;
  assigner.super_StaticAssigner.super_Assigner._vptr_Assigner =
       (_func_int **)&PTR__Assigner_00116900;
  diy::Bounds<int>::Bounds(&domain,3);
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[2] = 0;
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 0;
  domain.min.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 0;
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[2] = 0xff;
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[0] = 0xff;
  domain.max.super_small_vector<int,_4UL,_0UL,_std::allocator<int>_>.m_begin[1] = 0xff;
  for (rank = 0; rank != 8; rank = rank + 1) {
    poVar1 = std::operator<<((ostream *)&std::cout,"Rank ");
    poVar1 = (ostream *)std::ostream::operator<<((ostream *)poVar1,rank);
    poVar1 = std::operator<<(poVar1,":");
    std::endl<char,std::char_traits<char>>(poVar1);
    share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish
    .super__Bit_iterator_base._M_offset = 0;
    share_face.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    std::vector<bool,_std::allocator<bool>_>::push_back(&share_face,true);
    wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_offset = 0;
    wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)0x0;
    wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_offset = 0;
    wrap.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage = (_Bit_pointer)0x0;
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)
               &wrap.super__Bvector_base<std::allocator<bool>_>,true);
    std::vector<bool,_std::allocator<bool>_>::push_back
              ((vector<bool,_std::allocator<bool>_> *)
               &wrap.super__Bvector_base<std::allocator<bool>_>,true);
    ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
         (pointer)0x0;
    ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)0x0;
    ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x0;
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&ghosts,(int *)&stack0xfffffffffffffe48);
    std::vector<int,_std::allocator<int>_>::emplace_back<int>
              (&ghosts,(int *)&stack0xfffffffffffffe48);
    uVar4 = 0;
    uVar2 = 0x1037bc;
    uVar3 = 0;
    pcVar5 = std::
             _Function_handler<void_(int,_diy::Bounds<int>,_diy::Bounds<int>,_diy::Bounds<int>,_diy::RegularLink<diy::Bounds<int>_>),_void_(*)(int,_const_diy::Bounds<int>_&,_const_diy::Bounds<int>_&,_const_diy::Bounds<int>_&,_const_diy::Link_&)>
             ::_M_manager;
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_118,&share_face);
    std::vector<bool,_std::allocator<bool>_>::vector
              ((vector<bool,_std::allocator<bool>_> *)&local_d8,
               (vector<bool,_std::allocator<bool>_> *)
               &wrap.super__Bvector_base<std::allocator<bool>_>);
    std::vector<int,_std::allocator<int>_>::vector
              ((vector<int,_std::allocator<int>_> *)&local_f0,&ghosts);
    local_148._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_148._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._8_8_ = &local_f0;
    wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_start.
    super__Bit_iterator_base._M_p = (_Bit_type *)&local_d8;
    wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._M_p = (_Bit_type *)&local_148;
    wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data._M_finish.
    super__Bit_iterator_base._8_8_ = 0x103b66;
    wrap_00.super__Bvector_base<std::allocator<bool>_>._M_impl.super__Bvector_impl_data.
    _M_end_of_storage =
         (_Bit_pointer)
         ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
         _M_start;
    ghosts_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_finish = ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
                ._M_end_of_storage;
    ghosts_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = ghosts.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
           _M_finish;
    ghosts_00.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = piStack_1c0;
    divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _4_4_ = uVar3;
    divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start.
    _0_4_ = uVar2;
    divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish =
         (pointer)uVar4;
    divs.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)pcVar5;
    diy::decompose<diy::Bounds<int>>
              (3,rank,&domain,&assigner.super_StaticAssigner,(Creator *)&stack0xfffffffffffffe48,
               (BoolVector *)&local_118,wrap_00,ghosts_00,divs);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_148);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base(&local_f0);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_d8);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base(&local_118);
    std::_Function_base::~_Function_base((_Function_base *)&stack0xfffffffffffffe48);
    std::_Vector_base<int,_std::allocator<int>_>::~_Vector_base
              (&ghosts.super__Vector_base<int,_std::allocator<int>_>);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&wrap.super__Bvector_base<std::allocator<bool>_>);
    std::_Bvector_base<std::allocator<bool>_>::~_Bvector_base
              (&share_face.super__Bvector_base<std::allocator<bool>_>);
  }
  diy::Bounds<int>::~Bounds(&domain);
  return 0;
}

Assistant:

int main(int, char* [])
{
  int                       size    = 8;
  int                       nblocks = 32;
  diy::ContiguousAssigner   assigner(size, nblocks);
  //diy::RoundRobinAssigner   assigner(size, nblocks);

  Bounds domain(3);
  domain.min[0] = domain.min[1] = domain.min[2] = 0;
  domain.max[0] = domain.max[1] = domain.max[2] = 255;
  //domain.max[0] = domain.max[1] = domain.max[2] = 128;

  for (int rank = 0; rank < size; ++ rank)
  {
    std::cout << "Rank " << rank << ":" << std::endl;

    // share_face is an n-dim (size 3 in this example) vector of bools
    // indicating whether faces are shared in each dimension
    // uninitialized values default to false
    diy::RegularDecomposer<Bounds>::BoolVector          share_face;
    share_face.push_back(true);

    // wrap is an n-dim (size 3 in this example) vector of bools
    // indicating whether boundary conditions are periodic in each dimension
    // uninitialized values default to false
    diy::RegularDecomposer<Bounds>::BoolVector          wrap;
    wrap.push_back(true);
    wrap.push_back(true);

    // ghosts is an n-dim (size 3 in this example) vector of ints
    // indicating number of ghost cells per side in each dimension
    // uninitialized values default to 0
    diy::RegularDecomposer<Bounds>::CoordinateVector    ghosts;
    ghosts.push_back(1); ghosts.push_back(2);

    diy::decompose(3, rank, domain, assigner, create, share_face, wrap, ghosts);
  }
}